

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Segment::MakeNewCluster(Segment *this,uint64_t frame_timestamp_ns)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Cluster **ppCVar4;
  uint64_t uVar5;
  bool bVar6;
  Cluster **ppCVar7;
  ulong uVar8;
  int64_t iVar9;
  Cluster *pCVar10;
  _Rb_tree_header *p_Var11;
  ulong uVar12;
  
  iVar2 = this->cluster_list_capacity_;
  uVar3 = this->cluster_list_size_;
  if ((int)uVar3 < iVar2) goto LAB_0011ebb2;
  uVar12 = 1;
  if (0 < iVar2) {
    uVar12 = (ulong)(uint)(iVar2 * 2);
  }
  ppCVar7 = (Cluster **)operator_new__(uVar12 * 8,(nothrow_t *)&std::nothrow);
  if (ppCVar7 == (Cluster **)0x0) {
    return false;
  }
  ppCVar4 = this->cluster_list_;
  if ((int)uVar3 < 1) {
    if (ppCVar4 != (Cluster **)0x0) goto LAB_0011eb9f;
  }
  else {
    uVar8 = 0;
    do {
      ppCVar7[uVar8] = ppCVar4[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
LAB_0011eb9f:
    operator_delete__(ppCVar4);
  }
  this->cluster_list_ = ppCVar7;
  this->cluster_list_capacity_ = (int32_t)uVar12;
LAB_0011ebb2:
  bVar6 = WriteFramesLessThan(this,frame_timestamp_ns);
  if ((bVar6) &&
     (((long)this->cluster_list_size_ < 1 ||
      ((this->cluster_list_[(long)this->cluster_list_size_ + -1] != (Cluster *)0x0 &&
       (bVar6 = Cluster::Finalize(this->cluster_list_[(long)this->cluster_list_size_ + -1],true,
                                  frame_timestamp_ns), bVar6)))))) {
    if (this->output_cues_ == true) {
      this->new_cuepoint_ = true;
    }
    if ((this->chunking_ == true) && (0 < this->cluster_list_size_)) {
      MkvWriter::Close(this->chunk_writer_cluster_);
      this->chunk_count_ = this->chunk_count_ + 1;
      bVar6 = UpdateChunkName(this,"chk",&this->chunk_name_);
      if (!bVar6) {
        return false;
      }
      bVar6 = MkvWriter::Open(this->chunk_writer_cluster_,this->chunk_name_);
      if (!bVar6) {
        return false;
      }
    }
    uVar12 = (this->segment_info_).timecode_scale_;
    uVar8 = frame_timestamp_ns / uVar12;
    if ((0 < this->frames_size_) && (uVar12 = (*this->frames_)->timestamp_ / uVar12, uVar12 < uVar8)
       ) {
      uVar8 = uVar12;
    }
    ppCVar7 = this->cluster_list_;
    iVar2 = this->cluster_list_size_;
    iVar9 = MaxOffset(this);
    pCVar10 = (Cluster *)operator_new(0xa0,(nothrow_t *)&std::nothrow);
    if (pCVar10 != (Cluster *)0x0) {
      uVar5 = (this->segment_info_).timecode_scale_;
      bVar6 = this->accurate_cluster_duration_;
      bVar1 = this->fixed_size_cluster_timecode_;
      pCVar10->blocks_added_ = 0;
      pCVar10->finalized_ = false;
      pCVar10->fixed_size_timecode_ = bVar1;
      pCVar10->header_written_ = false;
      pCVar10->payload_size_ = 0;
      pCVar10->position_for_cues_ = iVar9;
      pCVar10->size_position_ = -1;
      pCVar10->timecode_ = uVar8;
      pCVar10->timecode_scale_ = uVar5;
      pCVar10->write_last_frame_with_duration_ = bVar6;
      p_Var11 = &(pCVar10->stored_frames_)._M_t._M_impl.super__Rb_tree_header;
      (pCVar10->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pCVar10->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (pCVar10->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var11->_M_header;
      (pCVar10->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var11->_M_header;
      (pCVar10->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var11 = &(pCVar10->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header;
      (pCVar10->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _S_red;
      (pCVar10->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (pCVar10->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var11->_M_header;
      (pCVar10->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var11->_M_header;
      (pCVar10->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pCVar10->writer_ = (IMkvWriter *)0x0;
      ppCVar7[iVar2] = pCVar10;
      if (this->writer_cluster_ != (IMkvWriter *)0x0) {
        pCVar10->writer_ = this->writer_cluster_;
        this->cluster_list_size_ = uVar3 + 1;
        return true;
      }
      return false;
    }
    ppCVar7[iVar2] = (Cluster *)0x0;
  }
  return false;
}

Assistant:

bool Segment::MakeNewCluster(uint64_t frame_timestamp_ns) {
  const int32_t new_size = cluster_list_size_ + 1;

  if (new_size > cluster_list_capacity_) {
    // Add more clusters.
    const int32_t new_capacity =
        (cluster_list_capacity_ <= 0) ? 1 : cluster_list_capacity_ * 2;
    Cluster** const clusters =
        new (std::nothrow) Cluster*[new_capacity];  // NOLINT
    if (!clusters)
      return false;

    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      clusters[i] = cluster_list_[i];
    }

    delete[] cluster_list_;

    cluster_list_ = clusters;
    cluster_list_capacity_ = new_capacity;
  }

  if (!WriteFramesLessThan(frame_timestamp_ns))
    return false;

  if (cluster_list_size_ > 0) {
    // Update old cluster's size
    Cluster* const old_cluster = cluster_list_[cluster_list_size_ - 1];

    if (!old_cluster || !old_cluster->Finalize(true, frame_timestamp_ns))
      return false;
  }

  if (output_cues_)
    new_cuepoint_ = true;

  if (chunking_ && cluster_list_size_ > 0) {
    chunk_writer_cluster_->Close();
    chunk_count_++;

    if (!UpdateChunkName("chk", &chunk_name_))
      return false;
    if (!chunk_writer_cluster_->Open(chunk_name_))
      return false;
  }

  const uint64_t timecode_scale = segment_info_.timecode_scale();
  const uint64_t frame_timecode = frame_timestamp_ns / timecode_scale;

  uint64_t cluster_timecode = frame_timecode;

  if (frames_size_ > 0) {
    const Frame* const f = frames_[0];  // earliest queued frame
    const uint64_t ns = f->timestamp();
    const uint64_t tc = ns / timecode_scale;

    if (tc < cluster_timecode)
      cluster_timecode = tc;
  }

  Cluster*& cluster = cluster_list_[cluster_list_size_];
  const int64_t offset = MaxOffset();
  cluster = new (std::nothrow)
      Cluster(cluster_timecode, offset, segment_info_.timecode_scale(),
              accurate_cluster_duration_, fixed_size_cluster_timecode_);
  if (!cluster)
    return false;

  if (!cluster->Init(writer_cluster_))
    return false;

  cluster_list_size_ = new_size;
  return true;
}